

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference c;
  reference opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar10;
  bool bVar11;
  Mat *top_blob;
  int op_type_r;
  Mat *B;
  Mat *A;
  bool a_is_lower;
  bool a_size_is_lower;
  bool a_rank_is_lower;
  bool b_is_scalar;
  Option *in_stack_00000248;
  int in_stack_00000254;
  Mat *in_stack_00000258;
  Mat *in_stack_00000260;
  Mat *in_stack_00000268;
  const_reference b;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int iVar12;
  int local_24;
  
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar12 = pvVar8->w;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar7 = pvVar8->h;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar1 = pvVar8->d;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar2 = pvVar8->c;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar10 = iVar12 * iVar7 * iVar1 * iVar2 * pvVar8->elempack == 1;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar12 = pvVar8->dims;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar4 = pvVar8->dims <= iVar12;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar12 = pvVar8->w;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar5 = iVar12 * pvVar8->h;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar6 = iVar5 * pvVar8->d;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar7 = pvVar8->c;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar1 = pvVar8->w;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar2 = pvVar8->h;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar3 = pvVar8->d;
  pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  bVar11 = iVar6 * iVar7 < iVar1 * iVar2 * iVar3 * pvVar8->c;
  if (bVar4 || bVar10) {
    in_stack_ffffffffffffff4f = bVar11;
  }
  if ((bVar4 || bVar10) && !bVar11) {
    pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    b = pvVar9;
    c = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
    iVar7 = *(int *)(in_RDI + 0xd0);
    pvVar8 = c;
  }
  else {
    pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
    b = pvVar9;
    pvVar8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
    c = pvVar8;
    iVar7 = get_reverse_op_type(*(int *)(in_RDI + 0xd0));
  }
  opt_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  Mat::create_like((Mat *)CONCAT44(iVar5,iVar12),
                   (Mat *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (Allocator *)b);
  bVar11 = true;
  if (opt_00->data != (void *)0x0) {
    bVar11 = opt_00->cstep * (long)opt_00->c == 0;
  }
  if (bVar11) {
    local_24 = -100;
  }
  else if (pvVar8->w * pvVar8->h * pvVar8->d * pvVar8->c == 1) {
    local_24 = binary_op_scalar((Mat *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                                ,(float)((ulong)b >> 0x20),c,iVar7,(Option *)opt_00);
  }
  else if ((((pvVar9->dims == pvVar8->dims) && (pvVar9->w == pvVar8->w)) && (pvVar9->h == pvVar8->h)
           ) && ((pvVar9->d == pvVar8->d && (pvVar9->c == pvVar8->c)))) {
    local_24 = binary_op_no_broadcast
                         ((Mat *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),b,c,
                          iVar7,(Option *)opt_00);
  }
  else if ((((pvVar8->dims < pvVar9->dims) ||
            ((((pvVar9->dims == 2 && (pvVar8->w == 1)) && (pvVar8->h == pvVar9->h)) ||
             ((((pvVar9->dims == 3 && (pvVar8->w == 1)) && (pvVar8->h == 1)) &&
              (pvVar8->c == pvVar9->c)))))) ||
           ((((pvVar9->dims == 3 && (pvVar8->w == 1)) &&
             ((pvVar8->h == pvVar9->h && (pvVar8->c == pvVar9->c)))) ||
            (((pvVar9->dims == 4 && (pvVar8->w == 1)) &&
             ((pvVar8->h == 1 && ((pvVar8->d == 1 && (pvVar8->c == pvVar9->c)))))))))) ||
          ((((pvVar9->dims == 4 &&
             (((pvVar8->w == 1 && (pvVar8->h == 1)) && (pvVar8->d == pvVar9->d)))) &&
            (pvVar8->c == pvVar9->c)) ||
           (((pvVar9->dims == 4 && (pvVar8->w == 1)) &&
            ((pvVar8->h == pvVar9->h && ((pvVar8->d == pvVar9->d && (pvVar8->c == pvVar9->c)))))))))
          ) {
    local_24 = binary_op_broadcast_inner
                         (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000254,
                          in_stack_00000248);
  }
  else if ((((pvVar9->dims == 2) && (pvVar8->w == pvVar9->w)) && (pvVar8->h == 1)) ||
          ((((((pvVar9->dims == 3 && (pvVar8->w == pvVar9->w)) &&
              ((pvVar8->h == 1 && (pvVar8->c == 1)))) ||
             (((((pvVar9->dims == 3 && (pvVar8->w == pvVar9->w)) && (pvVar8->h == pvVar9->h)) &&
               (pvVar8->c == 1)) ||
              ((((pvVar9->dims == 4 && (pvVar8->w == pvVar9->w)) && (pvVar8->h == 1)) &&
               ((pvVar8->d == 1 && (pvVar8->c == 1)))))))) ||
            (((pvVar9->dims == 4 && ((pvVar8->w == pvVar9->w && (pvVar8->h == pvVar9->h)))) &&
             ((pvVar8->d == 1 && (pvVar8->c == 1)))))) ||
           ((((pvVar9->dims == 4 && (pvVar8->w == pvVar9->w)) && (pvVar8->h == pvVar9->h)) &&
            ((pvVar8->d == pvVar9->d && (pvVar8->c == 1)))))))) {
    local_24 = binary_op_broadcast_outer
                         ((Mat *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),b,c,
                          iVar7,(Option *)opt_00);
  }
  else if (((pvVar9->dims == 3) && (pvVar8->dims == 3)) &&
          ((pvVar9->w == pvVar8->w && ((pvVar8->h == 1 && (pvVar9->c == pvVar8->c)))))) {
    local_24 = binary_op_broadcast_20
                         ((Mat *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),b,c,
                          iVar7,(Option *)opt_00);
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if ((A.dims == 2 && B.w == A.w && B.h == 1)
            || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1)
            || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1)
            || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1)
            || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1)
            || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}